

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::anon_unknown_1::ConsoleAssertionPrinter::printReconstructedExpression
          (ConsoleAssertionPrinter *this)

{
  bool bVar1;
  ostream *poVar2;
  string *in_RDI;
  Column *in_stack_00000018;
  ostream *in_stack_00000020;
  Colour colourGuard;
  undefined8 in_stack_ffffffffffffff78;
  Code _colourCode;
  Colour *in_stack_ffffffffffffff80;
  Column *in_stack_ffffffffffffff90;
  string local_60 [24];
  AssertionResult *in_stack_ffffffffffffffb8;
  AssertionResult *in_stack_ffffffffffffffd8;
  
  _colourCode = (Code)((ulong)in_stack_ffffffffffffff78 >> 0x20);
  bVar1 = AssertionResult::hasExpandedExpression(in_stack_ffffffffffffffd8);
  if (bVar1) {
    std::operator<<(*(ostream **)in_RDI,"with expansion:\n");
    Colour::Colour(in_stack_ffffffffffffff80,_colourCode);
    AssertionResult::getExpandedExpression_abi_cxx11_(in_stack_ffffffffffffffb8);
    clara::TextFlow::Column::Column(in_stack_ffffffffffffff90,in_RDI);
    clara::TextFlow::Column::indent((Column *)&stack0xffffffffffffffc0,2);
    poVar2 = clara::TextFlow::operator<<(in_stack_00000020,in_stack_00000018);
    std::operator<<(poVar2,'\n');
    clara::TextFlow::Column::~Column((Column *)0x14b78b);
    std::__cxx11::string::~string(local_60);
    Colour::~Colour((Colour *)0x14b79f);
  }
  return;
}

Assistant:

void printReconstructedExpression() const {
        if (result.hasExpandedExpression()) {
            stream << "with expansion:\n";
            Colour colourGuard(Colour::ReconstructedExpression);
            stream << Column(result.getExpandedExpression()).indent(2) << '\n';
        }
    }